

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O1

int patternTest(char *filename,char *resul,char *err,int options)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  char *pcVar6;
  FILE *__stream;
  char *__filename;
  FILE *__stream_00;
  long lVar7;
  long lVar8;
  long *plVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  long lVar12;
  undefined8 uVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  byte *ctx;
  byte *__s;
  bool bVar17;
  xmlChar *namespaces [22];
  char xml [500];
  char result [500];
  char str [1024];
  long local_928;
  long local_8e8 [22];
  char local_838 [4];
  undefined1 auStack_834 [508];
  char local_638 [499];
  undefined1 local_445;
  byte abStack_43a [2];
  stat64 local_438 [7];
  
  sVar5 = strlen(filename);
  sVar5 = (size_t)((int)sVar5 + -4);
  memcpy(local_838,filename,sVar5);
  local_838[sVar5] = '\0';
  pcVar6 = baseFilename(local_838);
  iVar1 = snprintf(local_638,499,"result/pattern/%s",pcVar6);
  if (0x1f2 < iVar1) {
    local_445 = 0;
  }
  auStack_834[sVar5] = 0;
  builtin_strncpy(local_838 + sVar5,".xml",4);
  iVar1 = stat64(local_838,(stat64 *)(abStack_43a + 2));
  if ((iVar1 == -1 || (local_438[0].st_mode & 0xf000) != 0x8000) && ((update_results & 1) == 0)) {
    pcVar6 = "Missing xml file %s\n";
    filename = local_838;
  }
  else {
    __stream = fopen64(filename,"rb");
    if (__stream != (FILE *)0x0) {
      pcVar6 = filename;
      __filename = resultFilename(filename,temp_directory,".res");
      if (__filename == (char *)0x0) {
        patternTest_cold_3();
        iVar1 = c14nCommonTest(pcVar6,1,0,"with-comments");
        return iVar1;
      }
      __stream_00 = fopen64(__filename,"wb");
      if (__stream_00 == (FILE *)0x0) {
        patternTest_cold_2();
        return -1;
      }
      pcVar6 = fgets((char *)(abStack_43a + 2),0x3ff,__stream);
      do {
        if (pcVar6 == (char *)0x0) {
          fclose(__stream);
          fclose(__stream_00);
          iVar1 = compareFiles(__filename,local_638);
          if (iVar1 != 0) {
            fprintf(_stderr,"Result for %s failed in %s\n",filename,local_638);
          }
          unlink(__filename);
          free(__filename);
          return (uint)(iVar1 != 0);
        }
        __s = abStack_43a + 2;
        sVar5 = strlen((char *)__s);
        if (0 < (int)(uint)sVar5) {
          lVar7 = (ulong)((uint)sVar5 & 0x7fffffff) + 1;
          do {
            if ((0x20 < (ulong)abStack_43a[lVar7]) ||
               ((0x100002600U >> ((ulong)abStack_43a[lVar7] & 0x3f) & 1) == 0)) break;
            abStack_43a[lVar7] = 0;
            lVar7 = lVar7 + -1;
          } while (1 < lVar7);
        }
        lVar7 = xmlReadFile(local_838,0,options);
        if (lVar7 == 0) {
          fprintf(_stderr,"Failed to parse %s\n",local_838);
        }
        else {
          lVar8 = xmlDocGetRootElement(lVar7);
          plVar9 = *(long **)(lVar8 + 0x60);
          if (plVar9 == (long *)0x0) {
            uVar14 = 0;
          }
          else {
            uVar15 = 0;
            do {
              local_8e8[uVar15] = plVar9[2];
              uVar14 = uVar15 + 2;
              local_8e8[uVar15 + 1] = plVar9[3];
              plVar9 = (long *)*plVar9;
              if (plVar9 == (long *)0x0) break;
              bVar17 = uVar15 < 0x12;
              uVar15 = uVar14;
            } while (bVar17);
          }
          local_8e8[uVar14 & 0xffffffff] = 0;
          local_8e8[(uVar14 & 0xffffffff) + 1] = 0;
          ctx = __s;
          lVar8 = xmlPatterncompile(__s,*(undefined8 *)(lVar7 + 0x98),0);
          if (lVar8 == 0) {
            testErrorHandler(ctx,"Pattern %s failed to compile\n",__s);
            xmlFreeDoc(lVar7);
          }
          else {
            local_928 = xmlPatternGetStreamCtxt(lVar8);
            if (local_928 == 0) {
LAB_0010b593:
              local_928 = 0;
            }
            else {
              iVar1 = xmlStreamPush(local_928,0,0);
              if (iVar1 < 0) {
                patternTest_cold_1();
                goto LAB_0010b593;
              }
            }
            nb_tests = nb_tests + 1;
            uVar10 = xmlReaderWalker(lVar7);
            while (iVar1 = xmlTextReaderRead(uVar10), iVar1 == 1) {
              iVar1 = xmlTextReaderNodeType(uVar10);
              iVar2 = xmlTextReaderIsEmptyElement(uVar10);
              if (iVar1 == 1) {
                uVar11 = xmlTextReaderCurrentNode(uVar10);
                iVar3 = xmlPatternMatch(lVar8,uVar11);
                if (iVar3 == 0) {
                  iVar3 = 0;
                  goto LAB_0010b62c;
                }
                uVar11 = xmlTextReaderCurrentNode(uVar10);
                lVar12 = xmlGetNodePath(uVar11);
                fprintf(__stream_00,"Node %s matches pattern %s\n",lVar12);
              }
              else {
                iVar3 = -1;
LAB_0010b62c:
                lVar12 = 0;
              }
              if (local_928 != 0) {
                lVar16 = local_928;
                if (iVar1 == 1) {
                  uVar11 = xmlTextReaderConstLocalName(uVar10);
                  uVar13 = xmlTextReaderConstNamespaceUri(uVar10);
                  iVar4 = xmlStreamPush(local_928,uVar11,uVar13);
                  if (iVar4 < 0) {
                    fwrite("xmlStreamPush() failure\n",0x18,1,__stream_00);
                    xmlFreeStreamCtxt(local_928);
                    lVar16 = 0;
                  }
                  else if (iVar4 != iVar3) {
                    if (lVar12 == 0) {
                      uVar11 = xmlTextReaderCurrentNode(uVar10);
                      lVar12 = xmlGetNodePath(uVar11);
                    }
                    fwrite("xmlPatternMatch and xmlStreamPush disagree\n",0x2b,1,__stream_00);
                    fprintf(__stream_00,"  pattern %s node %s\n",abStack_43a + 2,lVar12);
                  }
                }
                if (((iVar1 == 0xf) || (iVar1 == 1 && iVar2 != 0)) &&
                   (iVar1 = xmlStreamPop(lVar16), iVar1 < 0)) {
                  fwrite("xmlStreamPop() failure\n",0x17,1,__stream_00);
                  xmlFreeStreamCtxt(lVar16);
                }
              }
              if (lVar12 != 0) {
                (*_xmlFree)(lVar12);
              }
            }
            if (iVar1 != 0) {
              fprintf(__stream_00,"%s : failed to parse\n",filename);
            }
            xmlFreeTextReader(uVar10);
            xmlFreeDoc(lVar7);
            xmlFreeStreamCtxt(local_928);
            xmlFreePattern(lVar8);
          }
        }
        pcVar6 = fgets((char *)(abStack_43a + 2),0x3ff,__stream);
      } while( true );
    }
    pcVar6 = "Failed to open %s\n";
  }
  fprintf(_stderr,pcVar6,filename);
  return -1;
}

Assistant:

static int
patternTest(const char *filename,
            const char *resul ATTRIBUTE_UNUSED,
            const char *err ATTRIBUTE_UNUSED,
            int options) {
    xmlPatternPtr patternc = NULL;
    xmlStreamCtxtPtr patstream = NULL;
    FILE *o, *f;
    char str[1024];
    char xml[500];
    char result[500];
    int len, i;
    int ret = 0, res;
    char *temp;
    xmlTextReaderPtr reader;
    xmlDocPtr doc;

    len = strlen(filename);
    len -= 4;
    memcpy(xml, filename, len);
    xml[len] = 0;
    if (snprintf(result, 499, "result/pattern/%s", baseFilename(xml)) >= 499)
        result[499] = 0;
    memcpy(xml + len, ".xml", 5);

    if (!checkTestFile(xml) && !update_results) {
	fprintf(stderr, "Missing xml file %s\n", xml);
	return(-1);
    }
    f = fopen(filename, "rb");
    if (f == NULL) {
        fprintf(stderr, "Failed to open %s\n", filename);
	return(-1);
    }
    temp = resultFilename(filename, temp_directory, ".res");
    if (temp == NULL) {
        fprintf(stderr, "Out of memory\n");
        fatalError();
    }
    o = fopen(temp, "wb");
    if (o == NULL) {
	fprintf(stderr, "failed to open output file %s\n", temp);
	fclose(f);
        free(temp);
	return(-1);
    }
    while (1) {
	/*
	 * read one line in string buffer.
	 */
	if (fgets (&str[0], sizeof (str) - 1, f) == NULL)
	   break;

	/*
	 * remove the ending spaces
	 */
	i = strlen(str);
	while ((i > 0) &&
	       ((str[i - 1] == '\n') || (str[i - 1] == '\r') ||
		(str[i - 1] == ' ') || (str[i - 1] == '\t'))) {
	    i--;
	    str[i] = 0;
	}
	doc = xmlReadFile(xml, NULL, options);
	if (doc == NULL) {
	    fprintf(stderr, "Failed to parse %s\n", xml);
	    ret = 1;
	} else {
	    xmlNodePtr root;
	    const xmlChar *namespaces[22];
	    int j;
	    xmlNsPtr ns;

	    root = xmlDocGetRootElement(doc);
	    for (ns = root->nsDef, j = 0;ns != NULL && j < 20;ns=ns->next) {
		namespaces[j++] = ns->href;
		namespaces[j++] = ns->prefix;
	    }
	    namespaces[j++] = NULL;
	    namespaces[j] = NULL;

	    patternc = xmlPatterncompile((const xmlChar *) str, doc->dict,
					 0, &namespaces[0]);
	    if (patternc == NULL) {
		testErrorHandler(NULL,
			"Pattern %s failed to compile\n", str);
		xmlFreeDoc(doc);
		ret = 1;
		continue;
	    }
	    patstream = xmlPatternGetStreamCtxt(patternc);
	    if (patstream != NULL) {
		ret = xmlStreamPush(patstream, NULL, NULL);
		if (ret < 0) {
		    fprintf(stderr, "xmlStreamPush() failure\n");
		    xmlFreeStreamCtxt(patstream);
		    patstream = NULL;
		}
	    }
	    nb_tests++;

	    reader = xmlReaderWalker(doc);
	    res = xmlTextReaderRead(reader);
	    while (res == 1) {
		patternNode(o, reader, str, patternc, patstream);
		res = xmlTextReaderRead(reader);
	    }
	    if (res != 0) {
		fprintf(o, "%s : failed to parse\n", filename);
	    }
	    xmlFreeTextReader(reader);
	    xmlFreeDoc(doc);
	    xmlFreeStreamCtxt(patstream);
	    patstream = NULL;
	    xmlFreePattern(patternc);

	}
    }

    fclose(f);
    fclose(o);

    ret = compareFiles(temp, result);
    if (ret) {
	fprintf(stderr, "Result for %s failed in %s\n", filename, result);
	ret = 1;
    }
    if (temp != NULL) {
        unlink(temp);
        free(temp);
    }
    return(ret);
}